

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void fprint_vector_stats(FILE *file,vector<unsigned_long,_std::allocator<unsigned_long>_> *vec,
                        char *hdr,bool do_json)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  char *__format;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  unsigned_long uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  puVar1 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar2 - (long)puVar1;
  if (lVar5 == 0) {
    uVar11 = 0;
    auVar19 = ZEXT816(0);
    dVar17 = 0.0;
    uVar4 = 0;
    uVar7 = 0;
    uVar9 = 0;
  }
  else {
    lVar6 = lVar5 >> 3;
    uVar10 = lVar6 + (ulong)(lVar6 == 0);
    dVar17 = 0.0;
    dVar20 = 0.0;
    uVar8 = 0;
    do {
      uVar3 = puVar1[uVar8];
      dVar17 = dVar17 + ((double)(uVar3 * uVar3 >> 0x20 | 0x4530000000000000) -
                        1.9342813118337666e+25) +
                        (double)(uVar3 * uVar3 & 0xffffffff | 0x4330000000000000);
      dVar20 = dVar20 + ((double)(uVar3 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                        (double)(uVar3 & 0xffffffff | 0x4330000000000000);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    if (puVar2 == puVar1) {
      uVar11 = 0;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar17;
      auVar19 = auVar19 << 0x40;
      dVar17 = 0.0;
      uVar4 = 0;
      uVar7 = 0;
      uVar9 = 0;
    }
    else {
      auVar12._8_4_ = (int)(lVar5 >> 0x23);
      auVar12._0_8_ = lVar6;
      auVar12._12_4_ = 0x45300000;
      auVar16._0_8_ =
           ((double)(uVar10 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(uVar10 & 0xffffffff | 0x4330000000000000);
      auVar16._8_8_ =
           ((double)(lVar6 - 1U >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           (double)(lVar6 - 1U & 0xffffffff | 0x4330000000000000);
      auVar18._8_8_ =
           dVar17 - (dVar20 * dVar20) /
                    ((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
      auVar18._0_8_ = dVar20;
      uVar11 = puVar1[uVar10 >> 1];
      if ((uVar10 & 1) == 0) {
        lVar5 = uVar11 + puVar1[(uVar10 >> 1) - 1];
        auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar13._0_8_ = lVar5;
        auVar13._12_4_ = 0x45300000;
        dVar17 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * 0.5;
      }
      else {
        auVar14._8_4_ = (int)(uVar11 >> 0x20);
        auVar14._0_8_ = uVar11;
        auVar14._12_4_ = 0x45300000;
        dVar17 = (auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0);
      }
      auVar19 = divpd(auVar18,auVar16);
      uVar11 = *puVar1;
      uVar4 = puVar1[(long)(auVar16._0_8_ * 0.025)];
      uVar7 = puVar1[(long)(auVar16._0_8_ * 0.975)];
      uVar9 = puVar1[uVar10 - 1];
    }
  }
  dVar20 = auVar19._8_8_;
  if (dVar20 < 0.0) {
    dVar15 = sqrt(dVar20);
  }
  else {
    dVar15 = SQRT(dVar20);
  }
  __format = 
  "\n%s\n    mean:                %g\n    median:              %g\n    variance             %g\n    standard deviation:  %g\n    min:                 %ld\n    2.5%%:                %ld\n    97.5%%:               %ld\n    max:                 %ld\n"
  ;
  if (do_json) {
    __format = 
    ",\n\t\"%s\": {\n\t\t\"mean\":                %g,\n\t\t\"median\":              %g,\n\t\t\"variance\":            %g,\n\t\t\"standard deviation\":  %g,\n\t\t\"min\":                 %ld,\n\t\t\"2.5%%\":                %ld,\n\t\t\"97.5%%\":               %ld,\n\t\t\"max\":                 %ld}"
    ;
  }
  fprintf((FILE *)file,__format,auVar19._0_8_,dVar17,dVar20,dVar15,hdr,uVar11,uVar4,uVar7,uVar9);
  return;
}

Assistant:

void fprint_vector_stats( FILE * file, std::vector<size_t> & vec, const char * hdr, bool do_json )
{
    double sum = 0.,
           var = 0.,
           mean = 0.,
           median = 0.;
           
    long min = 0,
         two5 = 0,
         ninetyseven5 = 0,
         max = 0;
         
    size_t i;

    for ( i = 0; i < vec.size(); ++i ) {
        sum += vec[i];
        var += vec[i] * vec[i];
    }

    // remember, i == vec.size()

    if ( vec.size() ) {
        var = ( var - ( sum * sum ) / vec.size() ) / ( vec.size() - 1 );
        mean = sum / i;
        median = ( i % 2 ) ? 1.0 * vec[i / 2] : 0.5 * ( vec[i / 2] + vec[i / 2 - 1] );
        min = vec[0];
        two5 = vec[long( 0.025 * i )];
        ninetyseven5 = vec[long( 0.975 * i )];
        max = vec[i - 1];
    }

    if (do_json) {
        fprintf( file, ",\n\t\"%s\": {"
                 "\n\t\t\"mean\":                %g,"
                 "\n\t\t\"median\":              %g,"
                 "\n\t\t\"variance\":            %g,"
                 "\n\t\t\"standard deviation\":  %g,"
                 "\n\t\t\"min\":                 %ld,"
                 "\n\t\t\"2.5%%\":                %ld,"
                 "\n\t\t\"97.5%%\":               %ld,"
                 "\n\t\t\"max\":                 %ld}",
                 hdr,
                 mean,
                 median,
                 var,
                 sqrt( var ),
                 min,
                 two5,
                 ninetyseven5,
                 max
                );
   }
    else {
        fprintf( file, "\n%s\n"
                 "    mean:                %g\n"
                 "    median:              %g\n"
                 "    variance             %g\n"
                 "    standard deviation:  %g\n"
                 "    min:                 %ld\n"
                 "    2.5%%:                %ld\n"
                 "    97.5%%:               %ld\n"
                 "    max:                 %ld\n",
                 hdr,
                 mean,
                 median,
                 var,
                 sqrt( var ),
                 min,
                 two5,
                 ninetyseven5,
                 max
               );
        }
}